

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void adjustlocalvars(LexState *ls,int nvars)

{
  byte bVar1;
  short sVar2;
  undefined2 uVar3;
  int iVar4;
  FuncState *fs;
  Vardesc *pVVar5;
  TString *v;
  Proto *o;
  int iVar6;
  LocVar *pLVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  LocVar *pLVar11;
  
  if (0 < nvars) {
    fs = ls->fs;
    iVar6 = luaY_nvarstack(fs);
    iVar10 = 0;
    do {
      bVar1 = fs->nactvar;
      fs->nactvar = bVar1 + 1;
      pVVar5 = (fs->ls->dyd->actvar).arr;
      lVar8 = (long)fs->firstlocal + (ulong)bVar1;
      *(char *)((long)pVVar5 + lVar8 * 0x18 + 10) = (char)iVar6;
      v = *(TString **)((long)pVVar5 + lVar8 * 0x18 + 0x10);
      o = fs->f;
      iVar4 = o->sizelocvars;
      pLVar7 = (LocVar *)
               luaM_growaux_(ls->L,o->locvars,(int)fs->ndebugvars,&o->sizelocvars,0x10,0x7fff,
                             "local variables");
      o->locvars = pLVar7;
      if (iVar4 < o->sizelocvars) {
        lVar9 = (long)o->sizelocvars - (long)iVar4;
        pLVar11 = pLVar7 + iVar4;
        do {
          pLVar11->varname = (TString *)0x0;
          pLVar11 = pLVar11 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      sVar2 = fs->ndebugvars;
      pLVar7[sVar2].varname = v;
      pLVar7[sVar2].startpc = fs->pc;
      if (((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
        luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)v);
      }
      iVar6 = iVar6 + 1;
      uVar3 = fs->ndebugvars;
      fs->ndebugvars = uVar3 + 1;
      (&pVVar5->vd)[lVar8].pidx = uVar3;
      iVar10 = iVar10 + 1;
    } while (iVar10 != nvars);
  }
  return;
}

Assistant:

static void adjustlocalvars (LexState *ls, int nvars) {
  FuncState *fs = ls->fs;
  int reglevel = luaY_nvarstack(fs);
  int i;
  for (i = 0; i < nvars; i++) {
    int vidx = fs->nactvar++;
    Vardesc *var = getlocalvardesc(fs, vidx);
    var->vd.ridx = reglevel++;
    var->vd.pidx = registerlocalvar(ls, fs, var->vd.name);
  }
}